

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

buffer_appender<char>
fmt::v7::detail::write_exponent<char,fmt::v7::detail::buffer_appender<char>>
          (int exp,buffer_appender<char> it)

{
  back_insert_iterator<fmt::v7::detail::buffer<char>_> this;
  buffer<char> *in_RSI;
  int in_EDI;
  char *d;
  char *top;
  buffer_appender<char> *in_stack_ffffffffffffff78;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> in_stack_ffffffffffffff80;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_70;
  undefined1 local_61;
  undefined1 *local_60;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_58;
  undefined1 local_49;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_48;
  undefined1 local_39;
  undefined1 *local_38;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_30;
  undefined1 local_21;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_20;
  undefined1 local_15;
  int local_14;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_10;
  
  local_14 = in_EDI;
  local_10.container = in_RSI;
  if (in_EDI < 0) {
    local_15 = 0x2d;
    local_20.container =
         (buffer<char> *)buffer_appender<char>::operator++(in_stack_ffffffffffffff78,0);
    std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator*(&local_20);
    std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator=
              ((back_insert_iterator<fmt::v7::detail::buffer<char>_> *)
               in_stack_ffffffffffffff80.container,(value_type_conflict1 *)in_stack_ffffffffffffff78
              );
    local_14 = -local_14;
  }
  else {
    local_21 = 0x2b;
    local_30.container =
         (buffer<char> *)buffer_appender<char>::operator++(in_stack_ffffffffffffff78,0);
    std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator*(&local_30);
    std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator=
              ((back_insert_iterator<fmt::v7::detail::buffer<char>_> *)
               in_stack_ffffffffffffff80.container,(value_type_conflict1 *)in_stack_ffffffffffffff78
              );
  }
  if (99 < local_14) {
    local_38 = basic_data<void>::digits + (long)(local_14 / 100) * 2;
    if (999 < local_14) {
      local_39 = *local_38;
      local_48.container =
           (buffer<char> *)buffer_appender<char>::operator++(in_stack_ffffffffffffff78,0);
      std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator*(&local_48);
      std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator=
                ((back_insert_iterator<fmt::v7::detail::buffer<char>_> *)
                 in_stack_ffffffffffffff80.container,
                 (value_type_conflict1 *)in_stack_ffffffffffffff78);
    }
    local_49 = local_38[1];
    local_58.container =
         (buffer<char> *)buffer_appender<char>::operator++(in_stack_ffffffffffffff78,0);
    std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator*(&local_58);
    std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator=
              ((back_insert_iterator<fmt::v7::detail::buffer<char>_> *)
               in_stack_ffffffffffffff80.container,(value_type_conflict1 *)in_stack_ffffffffffffff78
              );
    local_14 = local_14 % 100;
  }
  local_60 = basic_data<void>::digits + (long)local_14 * 2;
  local_61 = *local_60;
  local_70.container =
       (buffer<char> *)buffer_appender<char>::operator++(in_stack_ffffffffffffff78,0);
  std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator*(&local_70);
  std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator=
            ((back_insert_iterator<fmt::v7::detail::buffer<char>_> *)
             in_stack_ffffffffffffff80.container,(value_type_conflict1 *)in_stack_ffffffffffffff78);
  this.container = (buffer<char> *)buffer_appender<char>::operator++(in_stack_ffffffffffffff78,0);
  std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator*
            ((back_insert_iterator<fmt::v7::detail::buffer<char>_> *)&stack0xffffffffffffff80);
  std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator=
            ((back_insert_iterator<fmt::v7::detail::buffer<char>_> *)this.container,
             (value_type_conflict1 *)in_stack_ffffffffffffff78);
  return (buffer_appender<char>)
         (back_insert_iterator<fmt::v7::detail::buffer<char>_>)local_10.container;
}

Assistant:

It write_exponent(int exp, It it) {
  FMT_ASSERT(-10000 < exp && exp < 10000, "exponent out of range");
  if (exp < 0) {
    *it++ = static_cast<Char>('-');
    exp = -exp;
  } else {
    *it++ = static_cast<Char>('+');
  }
  if (exp >= 100) {
    const char* top = data::digits[exp / 100];
    if (exp >= 1000) *it++ = static_cast<Char>(top[0]);
    *it++ = static_cast<Char>(top[1]);
    exp %= 100;
  }
  const char* d = data::digits[exp];
  *it++ = static_cast<Char>(d[0]);
  *it++ = static_cast<Char>(d[1]);
  return it;
}